

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::detail::decomp_assert(Enum at,char *file,int line,char *expr,Result *result)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  byte extraout_AL;
  ContextOptions *pCVar5;
  String *in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  ResultBuilder rb;
  ResultBuilder rb_1;
  bool failed;
  Enum in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  int line_00;
  TestCaseData *in_stack_fffffffffffffed0;
  Enum in_stack_fffffffffffffedc;
  ResultBuilder *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffef0;
  
  bVar2 = ((in_R8->field_0).buf[0] ^ 0xffU) & 1;
  line_00 = (int)((ulong)in_R8 >> 0x20);
  if ((is_running_in_test & 1) == 0) {
    if (bVar2 != 0) {
      ResultBuilder::ResultBuilder
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                 (char *)in_stack_fffffffffffffed0,line_00,
                 (char *)CONCAT17(in_stack_fffffffffffffec7,
                                  CONCAT16(in_stack_fffffffffffffec6,
                                           CONCAT24(in_stack_fffffffffffffec4,
                                                    in_stack_fffffffffffffec0))),"",
                 in_stack_fffffffffffffef0);
      String::operator=(&in_stack_fffffffffffffed0->m_file,in_R8);
      failed_out_of_a_testing_context((AssertData *)0x10c768);
      bVar3 = isDebuggerActive();
      if ((bVar3) && (pCVar5 = getContextOptions(), (pCVar5->no_breaks & 1U) == 0)) {
        pcVar1 = (code *)swi(3);
        uVar4 = (*pcVar1)();
        return (bool)uVar4;
      }
      bVar3 = checkIfShouldThrow(in_stack_fffffffffffffec0);
      if (bVar3) {
        throwException();
      }
      ResultBuilder::~ResultBuilder((ResultBuilder *)0x10c7d9);
    }
  }
  else {
    ResultBuilder::ResultBuilder
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,(char *)in_stack_fffffffffffffed0
               ,line_00,(char *)CONCAT17(in_stack_fffffffffffffec7,
                                         CONCAT16(in_stack_fffffffffffffec6,
                                                  CONCAT24(in_stack_fffffffffffffec4,
                                                           in_stack_fffffffffffffec0))),"",
               in_stack_fffffffffffffef0);
    if ((bVar2 != 0) ||
       (pCVar5 = getContextOptions(), __x = extraout_XMM0_Qa, (pCVar5->success & 1U) != 0)) {
      String::operator=(&in_stack_fffffffffffffed0->m_file,in_R8);
      __x = extraout_XMM0_Qa_00;
    }
    ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffed0,__x);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      uVar4 = (*pcVar1)();
      return (bool)uVar4;
    }
    if ((bVar2 != 0) && (bVar3 = checkIfShouldThrow(in_stack_fffffffffffffec0), bVar3)) {
      throwException();
    }
    ResultBuilder::~ResultBuilder((ResultBuilder *)0x10c8d5);
  }
  return (bool)((bVar2 ^ 0xff) & 1);
}

Assistant:

bool decomp_assert(assertType::Enum at, const char* file, int line, const char* expr,
                       Result result) {
        bool failed = !result.m_passed;

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(result.m_decomp);
        DOCTEST_ASSERT_IN_TESTS(result.m_decomp);
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return !failed;
    }